

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,int w,int h)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  double dVar8;
  int remain;
  int nn;
  float *Dp;
  float *rows1p;
  float *rows0p;
  float b1;
  float b0;
  float a1_1;
  float a0_1;
  float *S1p_1;
  float *S0p;
  int sx_2;
  int dx_2;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  float a1;
  float a0;
  float *S1p;
  int sx_1;
  int dx_1;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy_1;
  int dy_1;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int dy;
  int dx;
  int sy;
  int sx;
  float fy;
  float fx;
  float *beta;
  float *alpha;
  int *yofs;
  int *xofs;
  int *buf;
  double scale_y;
  double scale_x;
  Allocator *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int iVar9;
  Mat *in_stack_fffffffffffffe30;
  int local_1b0;
  float *local_1a8;
  float *local_1a0;
  float *local_198;
  int local_16c;
  float *local_158;
  int local_12c;
  float *local_120;
  int local_100;
  int local_fc;
  float *local_f8;
  float *local_f0;
  Mat local_d8;
  Mat local_a0;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  float local_58;
  float local_54;
  float *local_50;
  float *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  Mat *local_10;
  Mat *local_8;
  
  local_20 = (double)in_RDI->w / (double)in_EDX;
  local_28 = (double)in_RDI->h / (double)in_ECX;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(in_EDX * 3 + in_ECX * 3);
  uVar5 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = operator_new__(uVar5);
  local_40 = (void *)((long)local_38 + (long)local_14 * 4);
  local_48 = (float *)((long)local_38 + (long)local_18 * 4 + (long)local_14 * 4);
  local_50 = (float *)((long)local_38 +
                      (long)(local_14 << 1) * 4 + (long)local_18 * 4 + (long)local_14 * 4);
  local_30 = local_38;
  for (local_64 = 0; local_64 < local_14; local_64 = local_64 + 1) {
    local_54 = (float)(((double)local_64 + 0.5) * local_20 - 0.5);
    dVar8 = std::floor((double)(ulong)(uint)local_54);
    local_5c = (int)SUB84(dVar8,0);
    local_54 = local_54 - (float)local_5c;
    if (local_5c < 0) {
      local_5c = 0;
      local_54 = 0.0;
    }
    if (local_8->w + -1 <= local_5c) {
      local_5c = local_8->w + -2;
      local_54 = 1.0;
    }
    *(int *)((long)local_38 + (long)local_64 * 4) = local_5c;
    local_48[local_64 << 1] = 1.0 - local_54;
    local_48[local_64 * 2 + 1] = local_54;
  }
  for (local_68 = 0; iVar9 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20), local_68 < local_18;
      local_68 = local_68 + 1) {
    local_58 = (float)(((double)local_68 + 0.5) * local_28 - 0.5);
    dVar8 = std::floor((double)(ulong)(uint)local_58);
    local_60 = (int)SUB84(dVar8,0);
    local_58 = local_58 - (float)local_60;
    if (local_60 < 0) {
      local_60 = 0;
      local_58 = 0.0;
    }
    if (local_8->h + -1 <= local_60) {
      local_60 = local_8->h + -2;
      local_58 = 1.0;
    }
    *(int *)((long)local_40 + (long)local_68 * 4) = local_60;
    local_50[local_68 << 1] = 1.0 - local_58;
    local_50[local_68 * 2 + 1] = local_58;
  }
  Mat::Mat(in_stack_fffffffffffffe30,iVar9,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Mat::Mat(in_stack_fffffffffffffe30,iVar9,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_f0 = Mat::operator_cast_to_float_(&local_a0);
  local_f8 = Mat::operator_cast_to_float_(&local_d8);
  local_fc = -1;
  for (local_100 = 0; pfVar7 = local_f0, local_100 < local_18; local_100 = local_100 + 1) {
    iVar9 = *(int *)((long)local_40 + (long)local_100 * 4);
    if (iVar9 == local_fc) {
      local_f0 = local_f8;
      local_f8 = pfVar7;
      pfVar6 = Mat::row(local_8,iVar9 + 1);
      local_120 = local_48;
      for (local_12c = 0; local_12c < local_14; local_12c = local_12c + 1) {
        pfVar7[local_12c] =
             pfVar6[*(int *)((long)local_38 + (long)local_12c * 4)] * *local_120 +
             (pfVar6 + *(int *)((long)local_38 + (long)local_12c * 4))[1] * local_120[1];
        local_120 = local_120 + 2;
      }
    }
    else {
      pfVar7 = Mat::row(local_8,iVar9);
      pfVar6 = Mat::row(local_8,iVar9 + 1);
      local_158 = local_48;
      for (local_16c = 0; local_16c < local_14; local_16c = local_16c + 1) {
        iVar3 = *(int *)((long)local_38 + (long)local_16c * 4);
        fVar1 = *local_158;
        fVar2 = local_158[1];
        local_f0[local_16c] = pfVar7[iVar3] * fVar1 + (pfVar7 + iVar3)[1] * fVar2;
        local_f8[local_16c] = pfVar6[iVar3] * fVar1 + (pfVar6 + iVar3)[1] * fVar2;
        local_158 = local_158 + 2;
      }
    }
    local_fc = iVar9 + 1;
    fVar1 = *local_50;
    fVar2 = local_50[1];
    local_198 = local_f0;
    local_1a0 = local_f8;
    local_1a8 = Mat::row(local_10,local_100);
    for (local_1b0 = local_14; local_1b0 != 0; local_1b0 = local_1b0 + -1) {
      *local_1a8 = *local_198 * fVar1 + *local_1a0 * fVar2;
      local_1a8 = local_1a8 + 1;
      local_1a0 = local_1a0 + 1;
      local_198 = local_198 + 1;
    }
    local_50 = local_50 + 2;
  }
  if (local_30 != (void *)0x0) {
    operator_delete__(local_30);
  }
  Mat::~Mat((Mat *)0x15aeb1);
  Mat::~Mat((Mat *)0x15aebe);
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, int w, int h)
{
    double scale_x = (double)src.w / w;
    double scale_y = (double)src.h / h;

    int* buf = new int[w + h + w*2 + h*2];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    float* alpha = (float*)(buf + w + h);//new float[w * 2];
    float* beta = (float*)(buf + w + h + w*2);//new float[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= src.w - 1)
        {
            sx = src.w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = floor(fy);
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= src.h - 1)
        {
            sy = src.h - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        beta[dy*2    ] = 1.f - fy;
        beta[dy*2 + 1] = fy;
    }

    // loop body
    Mat rowsbuf0(w + 1);
    Mat rowsbuf1(w + 1);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -1;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S1p = S1 + sx;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S0np = S0 + sxn;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S0 = vld1_f32(S0p);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S0n = vld1_f32(S0np);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S0S0n = vcombine_f32(_S0, _S0n);
                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms0 = vmulq_f32(_S0S0n, _a);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows0 = vpadd_f32(vget_low_f32(_ms0), vget_high_f32(_ms0));
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows0p + dx, _rows0);
                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0]*a0 + S0p[1]*a1;
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy + 1;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

#if __ARM_NEON
        int nn = w >> 3;
#else
        int nn = 0;
#endif
        int remain = w - (nn << 3);

#if __ARM_NEON
        float32x4_t _b0 = vdupq_n_f32(b0);
        float32x4_t _b1 = vdupq_n_f32(b1);
        for (; nn>0; nn--)
        {
            float32x4_t _rows0 = vld1q_f32(rows0p);
            float32x4_t _rows1 = vld1q_f32(rows1p);

            float32x4_t _D = vmulq_f32(_rows0, _b0);
            _D = vmlaq_f32(_D, _rows1, _b1);

            vst1q_f32(Dp, _D);

            float32x4_t _rows0n = vld1q_f32(rows0p+4);
            float32x4_t _rows1n = vld1q_f32(rows1p+4);

            float32x4_t _Dn = vmulq_f32(_rows0n, _b0);
            _Dn = vmlaq_f32(_Dn, _rows1n, _b1);

            vst1q_f32(Dp+4, _Dn);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }

    delete[] buf;
}